

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O1

int Dau_DsdMergeStatus_rec(char *pStr,char **p,int *pMatches,int nShared,int *pStatus)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar8;
  char cVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  
  pcVar3 = *p;
  if (*pcVar3 == '!') {
    pStatus[(long)pcVar3 - (long)pStr] = -1;
    *p = pcVar3 + 1;
  }
  pcVar3 = *p;
  cVar9 = *pcVar3;
  if ((byte)(cVar9 + 0xbfU) < 6 || (byte)(cVar9 - 0x30U) < 10) {
    piVar5 = pStatus + ((long)pcVar3 - (long)pStr);
    do {
      pcVar3 = pcVar3 + 1;
      *piVar5 = -1;
      *p = pcVar3;
      cVar9 = *pcVar3;
      piVar5 = piVar5 + 1;
    } while ((byte)(cVar9 - 0x30U) < 10 || (byte)(cVar9 + 0xbfU) < 6);
  }
  if (cVar9 == '<') {
    lVar10 = (long)pMatches[(long)pcVar3 - (long)pStr];
    if ((pStr[lVar10 + 1] == '{') && (*p = pStr + lVar10 + 1, pcVar3 < pStr + lVar10 + 1)) {
      lVar6 = 0;
      if (pcVar3 <= pStr + lVar10) {
        lVar6 = (long)(pStr + lVar10) - (long)pcVar3;
      }
      memset(pStatus + ((long)pcVar3 - (long)pStr),0xff,lVar6 * 4 + 4);
    }
  }
  pbVar4 = (byte *)*p;
  bVar1 = *pbVar4;
  if ((byte)(bVar1 + 0x9f) < 0x1a) {
    uVar11 = (uint)(nShared <= (char)bVar1 + -0x61) * 3;
    lVar10 = (long)pbVar4 - (long)pStr;
  }
  else {
    uVar11 = bVar1 - 0x3c;
    if (((0x3f < uVar11) || ((0x8000000080000001U >> ((ulong)uVar11 & 0x3f) & 1) == 0)) &&
       (bVar1 != 0x28)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x157,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    lVar10 = (long)pbVar4 - (long)pStr;
    if ((uint)(bVar1 != 0x28) + (int)(char)bVar1 + 1 != (int)pStr[pMatches[lVar10]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x143,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    pbVar8 = (byte *)(pStr + pMatches[lVar10]);
    pbVar4 = pbVar4 + 1;
    *p = (char *)pbVar4;
    uVar11 = 0;
    uVar7 = 0;
    if (pbVar4 < pbVar8) {
      uVar7 = 0;
      uVar11 = 0;
      do {
        iVar2 = Dau_DsdMergeStatus_rec(pStr,p,pMatches,nShared,pStatus);
        uVar11 = uVar11 + (iVar2 == 3);
        uVar7 = uVar7 + 1;
        pbVar4 = (byte *)(*p + 1);
        *p = (char *)pbVar4;
      } while (pbVar4 < pbVar8);
    }
    if (pbVar4 != pbVar8) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x14a,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    if (uVar7 < 2) {
      __assert_fail("nTotal > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x14b,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
    }
    if (1 < uVar11) {
      bVar12 = uVar11 != uVar7;
      if (uVar11 < uVar7) {
        uVar11 = 2;
      }
      else {
        uVar11 = 3;
        if (bVar12) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                        ,0x154,"int Dau_DsdMergeStatus_rec(char *, char **, int *, int, int *)");
        }
      }
    }
  }
  pStatus[lVar10] = uVar11;
  return uVar11;
}

Assistant:

int Dau_DsdMergeStatus_rec( char * pStr, char ** p, int * pMatches, int nShared, int * pStatus )
{
    // none pure
    // 1 one pure
    // 2 two or more pure
    // 3 all pure
    if ( **p == '!' )
    {
        pStatus[*p - pStr] = -1;
        (*p)++;
    }
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        pStatus[*p - pStr] = -1;
        (*p)++;
    }
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[ *p - pStr ];
        if ( *(q+1) == '{' )
        {
            char * pTemp = *p;
            *p = q+1;
            for ( ; pTemp < q+1; pTemp++ )
                pStatus[pTemp - pStr] = -1;
        }
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return pStatus[*p - pStr] = (**p - 'a' < nShared) ? 0 : 3;
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int Status, nPure = 0, nTotal = 0;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Status = Dau_DsdMergeStatus_rec( pStr, p, pMatches, nShared, pStatus );
            nPure += (Status == 3);
            nTotal++;
        }
        assert( *p == q );
        assert( nTotal > 1 );
        if ( nPure == 0 )
            Status = 0;
        else if ( nPure == 1 )
            Status = 1;
        else if ( nPure < nTotal )
            Status = 2;
        else if ( nPure == nTotal ) 
            Status = 3;
        else assert( 0 );
        return (pStatus[pOld - pStr] = Status);
    }
    assert( 0 );
    return 0;
}